

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::filename(path *this)

{
  bool bVar1;
  iterator *this_00;
  reference this_01;
  path *in_RDI;
  path *in_stack_ffffffffffffff58;
  iterator *in_stack_ffffffffffffff60;
  path *in_stack_ffffffffffffff70;
  path *this_02;
  
  this_02 = in_RDI;
  bVar1 = has_relative_path(in_stack_ffffffffffffff70);
  if (bVar1) {
    end(this_02);
    this_00 = iterator::operator--(in_stack_ffffffffffffff60);
    this_01 = iterator::operator*(this_00);
    path(this_01,in_stack_ffffffffffffff58);
    iterator::~iterator((iterator *)0x28719c);
  }
  else {
    path((path *)0x287139);
  }
  return in_RDI;
}

Assistant:

GHC_INLINE path path::filename() const
{
    return !has_relative_path() ? path() : path(*--end());
}